

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

void __thiscall
gl4cts::FunctionObject::
tenary<tcu::Vector<double,_4>,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&>
::call(tenary<tcu::Vector<double,_4>,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&,_const_tcu::Vector<double,_4>_&>
       *this,GLvoid *result_dst,GLvoid *argument_src)

{
  double *pdVar1;
  undefined4 *puVar2;
  code *pcVar3;
  GLuint GVar4;
  GLuint GVar5;
  Vector<double,_4> result;
  arg3T arg_3;
  arg2T arg_2;
  arg1T arg_1;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  GVar4 = GPUShaderFP64Test10::functionObject::getArgumentOffset((functionObject *)this,1);
  GVar5 = GPUShaderFP64Test10::functionObject::getArgumentOffset((functionObject *)this,2);
  pcVar3 = (code *)(this->super_tenaryBase).super_functionObject.m_p_function;
  tcu::Vector<double,_4>::Vector(&arg_1);
  tcu::Vector<double,_4>::Vector(&arg_2);
  tcu::Vector<double,_4>::Vector(&arg_3);
  tcu::Vector<double,_4>::Vector(&result);
  arg_1.m_data[0] = *argument_src;
  arg_1.m_data[1] = *(double *)((long)argument_src + 8);
  arg_1.m_data[2] = *(double *)((long)argument_src + 0x10);
  arg_1.m_data[3] = *(double *)((long)argument_src + 0x18);
  pdVar1 = (double *)((long)argument_src + (ulong)GVar4);
  arg_2.m_data[0] = *pdVar1;
  arg_2.m_data[1] = pdVar1[1];
  pdVar1 = (double *)((long)argument_src + (ulong)GVar4 + 0x10);
  arg_2.m_data[2] = *pdVar1;
  arg_2.m_data[3] = pdVar1[1];
  puVar2 = (undefined4 *)((long)argument_src + (ulong)GVar5);
  arg_3.m_data[0]._0_4_ = *puVar2;
  arg_3.m_data[0]._4_4_ = puVar2[1];
  arg_3.m_data[1]._0_4_ = puVar2[2];
  arg_3.m_data[1]._4_4_ = puVar2[3];
  puVar2 = (undefined4 *)((long)argument_src + (ulong)GVar5 + 0x10);
  arg_3.m_data[2]._0_4_ = *puVar2;
  arg_3.m_data[2]._4_4_ = puVar2[1];
  arg_3.m_data[3]._0_4_ = puVar2[2];
  arg_3.m_data[3]._4_4_ = puVar2[3];
  (*pcVar3)(&local_50,&arg_1,&arg_2,&arg_3);
  *(undefined8 *)((long)result_dst + 0x10) = local_40;
  *(undefined8 *)((long)result_dst + 0x18) = uStack_38;
  *(undefined8 *)result_dst = local_50;
  *(undefined8 *)((long)result_dst + 8) = uStack_48;
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_2_offset = getArgumentOffset(1);
		const glw::GLuint argument_3_offset = getArgumentOffset(2);

		functionPointer p_function = (functionPointer)m_p_function;

		arg1T arg_1;
		arg2T arg_2;
		arg3T arg_3;
		ResT  result;

		unpack<arg1T>::get(argument_src, arg_1);
		unpack<arg2T>::get((glw::GLubyte*)argument_src + argument_2_offset, arg_2);
		unpack<arg3T>::get((glw::GLubyte*)argument_src + argument_3_offset, arg_3);

		result = p_function(arg_1, arg_2, arg_3);

		pack<ResT>::set(result_dst, result);
	}